

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.hpp
# Opt level: O3

string * vkt::SpirVAssembly::numberToString<float>(string *__return_storage_ptr__,float number)

{
  stringstream ss;
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::ostream::_M_insert<double>((double)number);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return __return_storage_ptr__;
}

Assistant:

const std::string numberToString (T number)
{
	std::stringstream ss;
	ss << number;
	return ss.str();
}